

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O0

void __thiscall
MT32Emu::MidiStreamParserImpl::processShortMessage(MidiStreamParserImpl *this,Bit32u message)

{
  bool bVar1;
  undefined8 in_RDX;
  byte local_15;
  Bit32u local_14;
  Bit8u status;
  MidiStreamParserImpl *pMStack_10;
  Bit32u message_local;
  MidiStreamParserImpl *this_local;
  
  local_15 = (byte)message;
  local_14 = message;
  pMStack_10 = this;
  if (local_15 < 0xf8) {
    bVar1 = processStatusByte(this,&local_15);
    if (bVar1) {
      (**this->midiReceiver->_vptr_MidiReceiver)
                (this->midiReceiver,(ulong)(local_14 << 8 | (uint)local_15));
    }
    else if (0x7f < local_15) {
      (**this->midiReceiver->_vptr_MidiReceiver)(this->midiReceiver,(ulong)local_14);
    }
  }
  else {
    (*this->midiReceiver->_vptr_MidiReceiver[2])
              (this->midiReceiver,(ulong)local_15,in_RDX,(ulong)local_15);
  }
  return;
}

Assistant:

void MidiStreamParserImpl::processShortMessage(const Bit32u message) {
	// Adds running status to the MIDI message if it doesn't contain one
	Bit8u status = Bit8u(message & 0xFF);
	if (0xF8 <= status) {
		midiReceiver.handleSystemRealtimeMessage(status);
	} else if (processStatusByte(status)) {
		midiReceiver.handleShortMessage((message << 8) | status);
	} else if (0x80 <= status) { // If no running status available yet, skip this message
		midiReceiver.handleShortMessage(message);
	}
}